

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint * create_begins_with_string_constraint(char *expected_value,char *expected_value_name)

{
  CgreenValue expected_value_00;
  Constraint *pCVar1;
  Constraint *constraint;
  char *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  make_cgreen_string_value(in_stack_ffffffffffffffc0);
  expected_value_00.value.string_value = in_stack_ffffffffffffffd8;
  expected_value_00._0_8_ = in_stack_ffffffffffffffd0;
  expected_value_00.value_size = in_stack_ffffffffffffffe0;
  pCVar1 = create_constraint_expecting(expected_value_00,in_stack_ffffffffffffffd8);
  pCVar1->type = CGREEN_STRING_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_want_beginning_of_string;
  pCVar1->execute = test_want;
  pCVar1->name = "begin with string";
  pCVar1->destroy = destroy_string_constraint;
  pCVar1->expected_value_message = "\t\texpected to begin with:\t\t[\"%s\"]";
  return pCVar1;
}

Assistant:

Constraint *create_begins_with_string_constraint(const char* expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_string_value(expected_value), expected_value_name);
    constraint->type = CGREEN_STRING_COMPARER_CONSTRAINT;

    constraint->compare = &compare_want_beginning_of_string;
    constraint->execute = &test_want;
    constraint->name = "begin with string";
    constraint->destroy = &destroy_string_constraint;
    constraint->expected_value_message = "\t\texpected to begin with:\t\t[\"%s\"]";

    return constraint;
}